

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O0

U32 duckdb_zstd::ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  int iVar1;
  U32 rawStat;
  int in_ECX;
  optState_t *in_RDX;
  uint in_ESI;
  U32 litPrice;
  U32 u;
  U32 litPriceMax;
  U32 price;
  uint local_38;
  uint local_34;
  uint local_30;
  U32 local_28;
  U32 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = ZSTD_compressedLiterals(in_RDX);
    if (iVar1 == 0) {
      local_4 = in_ESI << 0xb;
    }
    else if (in_RDX->priceType == zop_predef) {
      local_4 = in_ESI * 0x600;
    }
    else {
      local_28 = in_RDX->litSumBasePrice * in_ESI;
      rawStat = in_RDX->litSumBasePrice - 0x100;
      for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
        if (in_ECX == 0) {
          local_38 = ZSTD_bitWeight(0);
        }
        else {
          local_38 = ZSTD_fracWeight(rawStat);
        }
        local_34 = local_38;
        if (rawStat < local_38) {
          local_34 = rawStat;
        }
        local_28 = local_28 - local_34;
      }
      local_4 = local_28;
    }
  }
  return local_4;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    DEBUGLOG(8, "ZSTD_rawLiteralsCost (%u literals)", litLength);
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = optPtr->litSumBasePrice * litLength;
        U32 const litPriceMax = optPtr->litSumBasePrice - BITCOST_MULTIPLIER;
        U32 u;
        assert(optPtr->litSumBasePrice >= BITCOST_MULTIPLIER);
        for (u=0; u < litLength; u++) {
            U32 litPrice = WEIGHT(optPtr->litFreq[literals[u]], optLevel);
            if (UNLIKELY(litPrice > litPriceMax)) litPrice = litPriceMax;
            price -= litPrice;
        }
        return price;
    }
}